

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchy.c
# Opt level: O3

char * path_elem(char *path,char *buff,char *sep)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  char cVar5;
  
  cVar5 = *path;
  if (cVar5 == '\0') {
    pcVar3 = (char *)0x0;
  }
  else {
    lVar4 = 0;
    do {
      _ecs_assert(lVar4 < 0x40,2,(char *)0x0,"bptr - buff < ECS_MAX_NAME_LENGTH",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/hierarchy.c"
                  ,0xf1);
      if (0x3f < lVar4) {
        __assert_fail("bptr - buff < (64)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/hierarchy.c"
                      ,0xf1,"const char *path_elem(const char *, char *, const char *)");
      }
      sVar2 = strlen(sep);
      iVar1 = strncmp(path + lVar4,sep,(long)(int)sVar2);
      if (iVar1 == 0) {
        buff[lVar4] = '\0';
        return path + lVar4 + ((long)((sVar2 << 0x20) + -0x100000000) >> 0x20) + 1;
      }
      buff[lVar4] = cVar5;
      cVar5 = path[lVar4 + 1];
      lVar4 = lVar4 + 1;
    } while (cVar5 != '\0');
    buff[lVar4] = '\0';
    pcVar3 = path + lVar4;
  }
  return pcVar3;
}

Assistant:

static
const char *path_elem(
    const char *path,
    char *buff,
    const char *sep)
{
    const char *ptr;
    char *bptr, ch;

    for (bptr = buff, ptr = path; (ch = *ptr); ptr ++) {
        ecs_assert(bptr - buff < ECS_MAX_NAME_LENGTH, ECS_INVALID_PARAMETER, 
            NULL);
            
        if (is_sep(&ptr, sep)) {
            *bptr = '\0';
            return ptr + 1;
        } else {
            *bptr = ch;
            bptr ++;
        }
    }

    if (bptr != buff) {
        *bptr = '\0';
        return ptr;
    } else {
        return NULL;
    }
}